

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_term_indexer.cc
# Opt level: O1

string * __thiscall
S2RegionTermIndexer::GetTerm_abi_cxx11_
          (string *__return_storage_ptr__,S2RegionTermIndexer *this,TermType term_type,S2CellId *id,
          string_view prefix)

{
  size_type sVar1;
  undefined1 *puVar2;
  string *psVar3;
  undefined8 extraout_RAX;
  AlphaNum *c;
  AlphaNum *local_c0;
  size_type local_b8;
  undefined1 local_90 [48];
  AlphaNum local_60;
  string local_30;
  
  local_b8 = prefix.length_;
  c = (AlphaNum *)prefix.ptr_;
  local_c0 = c;
  if (term_type == ANCESTOR) {
    S2CellId::ToToken_abi_cxx11_((string *)local_90,id);
    local_60.piece_.ptr_ = (char *)local_90._0_8_;
    if (-1 < (long)local_90._8_8_) {
      local_60.piece_.length_ = local_90._8_8_;
      absl::StrCat_abi_cxx11_
                (__return_storage_ptr__,(absl *)&local_c0,&local_60,(AlphaNum *)local_90._0_8_);
      psVar3 = (string *)local_90;
LAB_0022025b:
      puVar2 = *(undefined1 **)((psVar3->field_2)._M_local_buf + -0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2 != &psVar3->field_2) {
        operator_delete(puVar2);
      }
      return __return_storage_ptr__;
    }
  }
  else {
    local_60.piece_.ptr_ = (this->options_).marker_._M_dataplus._M_p;
    sVar1 = (this->options_).marker_._M_string_length;
    if ((long)sVar1 < 0) {
      GetTerm_abi_cxx11_();
    }
    else {
      local_60.piece_.length_ = sVar1;
      S2CellId::ToToken_abi_cxx11_(&local_30,id);
      local_90._0_8_ = local_30._M_dataplus._M_p;
      if (-1 < (long)local_30._M_string_length) {
        local_90._8_8_ = local_30._M_string_length;
        absl::StrCat_abi_cxx11_
                  (__return_storage_ptr__,(absl *)&local_c0,&local_60,(AlphaNum *)local_90,c);
        psVar3 = &local_30;
        goto LAB_0022025b;
      }
    }
    GetTerm_abi_cxx11_();
  }
  GetTerm_abi_cxx11_();
  if ((AlphaNum *)local_90._0_8_ != (AlphaNum *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

string S2RegionTermIndexer::GetTerm(TermType term_type, const S2CellId& id,
                                    string_view prefix) const {
  // There are generally more ancestor terms than covering terms, so we add
  // the extra "marker" character to the covering terms to distinguish them.
  if (term_type == TermType::ANCESTOR) {
    return absl::StrCat(prefix, id.ToToken());
  } else {
    return absl::StrCat(prefix, options_.marker(), id.ToToken());
  }
}